

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

EnumValueDescriptor * __thiscall
google::protobuf::EnumDescriptor::FindValueByName(EnumDescriptor *this,string *key)

{
  size_type __bkt;
  ulong uVar1;
  __node_ptr p_Var2;
  int *piVar3;
  char cVar4;
  EnumValueDescriptor *pEVar5;
  char *pcVar6;
  
  pcVar6 = (key->_M_dataplus)._M_p;
  __bkt = (*(undefined8 **)(*(long *)(this + 0x10) + 0x90))[1];
  cVar4 = *pcVar6;
  if (cVar4 == '\0') {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      pcVar6 = pcVar6 + 1;
      uVar1 = (long)cVar4 + uVar1 * 5;
      cVar4 = *pcVar6;
    } while (cVar4 != '\0');
  }
  p_Var2 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)**(undefined8 **)(*(long *)(this + 0x10) + 0x90),__bkt,
                          (key_type *)(((long)this * 0x1000193 ^ uVar1) % __bkt),(__hash_code)this);
  piVar3 = (int *)((long)&(p_Var2->
                          super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                          ._M_storage._M_storage + 0x10);
  if (p_Var2 == (__node_ptr)0x0) {
    piVar3 = &(anonymous_namespace)::kNullSymbol;
  }
  pEVar5 = (EnumValueDescriptor *)0x0;
  if ((anonymous_namespace)::kNullSymbol != 0) {
    pEVar5 = DAT_00790e10;
  }
  if (*piVar3 == 5) {
    pEVar5 = *(EnumValueDescriptor **)(piVar3 + 2);
  }
  return pEVar5;
}

Assistant:

const EnumValueDescriptor* EnumDescriptor::FindValueByName(
    const std::string& key) const {
  Symbol result =
      file()->tables_->FindNestedSymbolOfType(this, key, Symbol::ENUM_VALUE);
  if (!result.IsNull()) {
    return result.enum_value_descriptor;
  } else {
    return nullptr;
  }
}